

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O3

Calendar * icu_63::createStandardCalendar(ECalType calType,Locale *loc,UErrorCode *status)

{
  Calendar *pCVar1;
  GregorianCalendar *pGVar2;
  ChineseCalendar *this;
  
  switch(calType) {
  case CALTYPE_GREGORIAN:
    pGVar2 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x290,(size_t)loc);
    if (pGVar2 != (GregorianCalendar *)0x0) {
      GregorianCalendar::GregorianCalendar(pGVar2,loc,status);
      return &pGVar2->super_Calendar;
    }
    break;
  case CALTYPE_JAPANESE:
    pCVar1 = (Calendar *)UMemory::operator_new((UMemory *)0x290,(size_t)loc);
    if (pCVar1 != (Calendar *)0x0) {
      JapaneseCalendar::JapaneseCalendar((JapaneseCalendar *)pCVar1,loc,status);
      return pCVar1;
    }
    break;
  case CALTYPE_BUDDHIST:
    pCVar1 = (Calendar *)UMemory::operator_new((UMemory *)0x290,(size_t)loc);
    if (pCVar1 != (Calendar *)0x0) {
      BuddhistCalendar::BuddhistCalendar((BuddhistCalendar *)pCVar1,loc,status);
      return pCVar1;
    }
    break;
  case CALTYPE_ROC:
    pCVar1 = (Calendar *)UMemory::operator_new((UMemory *)0x290,(size_t)loc);
    if (pCVar1 != (Calendar *)0x0) {
      TaiwanCalendar::TaiwanCalendar((TaiwanCalendar *)pCVar1,loc,status);
      return pCVar1;
    }
    break;
  case CALTYPE_PERSIAN:
    pCVar1 = (Calendar *)UMemory::operator_new((UMemory *)0x268,(size_t)loc);
    if (pCVar1 != (Calendar *)0x0) {
      PersianCalendar::PersianCalendar((PersianCalendar *)pCVar1,loc,status);
      return pCVar1;
    }
    break;
  case CALTYPE_ISLAMIC_CIVIL:
    pCVar1 = (Calendar *)UMemory::operator_new((UMemory *)0x268,(size_t)loc);
    if (pCVar1 != (Calendar *)0x0) {
      IslamicCalendar::IslamicCalendar((IslamicCalendar *)pCVar1,loc,status,CIVIL);
      return pCVar1;
    }
    break;
  case CALTYPE_ISLAMIC:
  case CALTYPE_ISLAMIC_RGSA:
    pCVar1 = (Calendar *)UMemory::operator_new((UMemory *)0x268,(size_t)loc);
    if (pCVar1 != (Calendar *)0x0) {
      IslamicCalendar::IslamicCalendar((IslamicCalendar *)pCVar1,loc,status,ASTRONOMICAL);
      return pCVar1;
    }
    break;
  case CALTYPE_HEBREW:
    pCVar1 = (Calendar *)UMemory::operator_new((UMemory *)0x268,(size_t)loc);
    if (pCVar1 != (Calendar *)0x0) {
      HebrewCalendar::HebrewCalendar((HebrewCalendar *)pCVar1,loc,status);
      return pCVar1;
    }
    break;
  case CALTYPE_CHINESE:
    this = (ChineseCalendar *)UMemory::operator_new((UMemory *)0x270,(size_t)loc);
    if (this != (ChineseCalendar *)0x0) {
      ChineseCalendar::ChineseCalendar(this,loc,status);
      return &this->super_Calendar;
    }
    break;
  case CALTYPE_INDIAN:
    pCVar1 = (Calendar *)UMemory::operator_new((UMemory *)0x268,(size_t)loc);
    if (pCVar1 != (Calendar *)0x0) {
      IndianCalendar::IndianCalendar((IndianCalendar *)pCVar1,loc,status);
      return pCVar1;
    }
    break;
  case CALTYPE_COPTIC:
    pCVar1 = (Calendar *)UMemory::operator_new((UMemory *)0x268,(size_t)loc);
    if (pCVar1 != (Calendar *)0x0) {
      CopticCalendar::CopticCalendar((CopticCalendar *)pCVar1,loc,status);
      return pCVar1;
    }
    break;
  case CALTYPE_ETHIOPIC:
    pCVar1 = (Calendar *)UMemory::operator_new((UMemory *)0x268,(size_t)loc);
    if (pCVar1 != (Calendar *)0x0) {
      EthiopicCalendar::EthiopicCalendar((EthiopicCalendar *)pCVar1,loc,status,AMETE_MIHRET_ERA);
      return pCVar1;
    }
    break;
  case CALTYPE_ETHIOPIC_AMETE_ALEM:
    pCVar1 = (Calendar *)UMemory::operator_new((UMemory *)0x268,(size_t)loc);
    if (pCVar1 != (Calendar *)0x0) {
      EthiopicCalendar::EthiopicCalendar((EthiopicCalendar *)pCVar1,loc,status,AMETE_ALEM_ERA);
      return pCVar1;
    }
    break;
  case CALTYPE_ISO8601:
    pGVar2 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x290,(size_t)loc);
    if (pGVar2 != (GregorianCalendar *)0x0) {
      GregorianCalendar::GregorianCalendar(pGVar2,loc,status);
    }
    if ((pGVar2->super_Calendar).fFirstDayOfWeek != UCAL_MONDAY) {
      (pGVar2->super_Calendar).fFirstDayOfWeek = UCAL_MONDAY;
      (pGVar2->super_Calendar).fAreFieldsSet = '\0';
    }
    if ((pGVar2->super_Calendar).fMinimalDaysInFirstWeek == '\x04') {
      return &pGVar2->super_Calendar;
    }
    (pGVar2->super_Calendar).fMinimalDaysInFirstWeek = '\x04';
    (pGVar2->super_Calendar).fAreFieldsSet = '\0';
    return &pGVar2->super_Calendar;
  case CALTYPE_DANGI:
    pCVar1 = (Calendar *)UMemory::operator_new((UMemory *)0x270,(size_t)loc);
    if (pCVar1 != (Calendar *)0x0) {
      DangiCalendar::DangiCalendar((DangiCalendar *)pCVar1,loc,status);
      return pCVar1;
    }
    break;
  case CALTYPE_ISLAMIC_UMALQURA:
    pCVar1 = (Calendar *)UMemory::operator_new((UMemory *)0x268,(size_t)loc);
    if (pCVar1 != (Calendar *)0x0) {
      IslamicCalendar::IslamicCalendar((IslamicCalendar *)pCVar1,loc,status,UMALQURA);
      return pCVar1;
    }
    break;
  case CALTYPE_ISLAMIC_TBLA:
    pCVar1 = (Calendar *)UMemory::operator_new((UMemory *)0x268,(size_t)loc);
    if (pCVar1 != (Calendar *)0x0) {
      IslamicCalendar::IslamicCalendar((IslamicCalendar *)pCVar1,loc,status,TBLA);
      return pCVar1;
    }
    break;
  default:
    *status = U_UNSUPPORTED_ERROR;
  }
  return (Calendar *)0x0;
}

Assistant:

static Calendar *createStandardCalendar(ECalType calType, const Locale &loc, UErrorCode& status) {
    Calendar *cal = NULL;

    switch (calType) {
        case CALTYPE_GREGORIAN:
            cal = new GregorianCalendar(loc, status);
            break;
        case CALTYPE_JAPANESE:
            cal = new JapaneseCalendar(loc, status);
            break;
        case CALTYPE_BUDDHIST:
            cal = new BuddhistCalendar(loc, status);
            break;
        case CALTYPE_ROC:
            cal = new TaiwanCalendar(loc, status);
            break;
        case CALTYPE_PERSIAN:
            cal = new PersianCalendar(loc, status);
            break;
        case CALTYPE_ISLAMIC_TBLA:
            cal = new IslamicCalendar(loc, status, IslamicCalendar::TBLA);
            break;
        case CALTYPE_ISLAMIC_CIVIL:
            cal = new IslamicCalendar(loc, status, IslamicCalendar::CIVIL);
            break;
        case CALTYPE_ISLAMIC_RGSA:
            // default any region specific not handled individually to islamic
        case CALTYPE_ISLAMIC:
            cal = new IslamicCalendar(loc, status, IslamicCalendar::ASTRONOMICAL);
            break;
        case CALTYPE_ISLAMIC_UMALQURA:
            cal = new IslamicCalendar(loc, status, IslamicCalendar::UMALQURA);
            break;
        case CALTYPE_HEBREW:
            cal = new HebrewCalendar(loc, status);
            break;
        case CALTYPE_CHINESE:
            cal = new ChineseCalendar(loc, status);
            break;
        case CALTYPE_INDIAN:
            cal = new IndianCalendar(loc, status);
            break;
        case CALTYPE_COPTIC:
            cal = new CopticCalendar(loc, status);
            break;
        case CALTYPE_ETHIOPIC:
            cal = new EthiopicCalendar(loc, status, EthiopicCalendar::AMETE_MIHRET_ERA);
            break;
        case CALTYPE_ETHIOPIC_AMETE_ALEM:
            cal = new EthiopicCalendar(loc, status, EthiopicCalendar::AMETE_ALEM_ERA);
            break;
        case CALTYPE_ISO8601:
            cal = new GregorianCalendar(loc, status);
            cal->setFirstDayOfWeek(UCAL_MONDAY);
            cal->setMinimalDaysInFirstWeek(4);
            break;
        case CALTYPE_DANGI:
            cal = new DangiCalendar(loc, status);
            break;
        default:
            status = U_UNSUPPORTED_ERROR;
    }
    return cal;
}